

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O3

void iadst16_low8_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  __m256i alVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  
  lVar12 = (long)bit * 0x100;
  iVar13 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x168);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  auVar47._16_4_ = uVar1;
  auVar47._20_4_ = uVar1;
  auVar47._24_4_ = uVar1;
  auVar47._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 600);
  auVar49._4_4_ = uVar1;
  auVar49._0_4_ = uVar1;
  auVar49._8_4_ = uVar1;
  auVar49._12_4_ = uVar1;
  auVar49._16_4_ = uVar1;
  auVar49._20_4_ = uVar1;
  auVar49._24_4_ = uVar1;
  auVar49._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x188);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x238);
  auVar42._4_4_ = uVar1;
  auVar42._0_4_ = uVar1;
  auVar42._8_4_ = uVar1;
  auVar42._12_4_ = uVar1;
  auVar42._16_4_ = uVar1;
  auVar42._20_4_ = uVar1;
  auVar42._24_4_ = uVar1;
  auVar42._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1a8);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x218);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1c8);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1f8);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1e8);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar46._16_4_ = uVar1;
  auVar46._20_4_ = uVar1;
  auVar46._24_4_ = uVar1;
  auVar46._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1d8);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar45._16_4_ = uVar1;
  auVar45._20_4_ = uVar1;
  auVar45._24_4_ = uVar1;
  auVar45._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x208);
  auVar39._4_4_ = uVar1;
  auVar39._0_4_ = uVar1;
  auVar39._8_4_ = uVar1;
  auVar39._12_4_ = uVar1;
  auVar39._16_4_ = uVar1;
  auVar39._20_4_ = uVar1;
  auVar39._24_4_ = uVar1;
  auVar39._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1b8);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar50._16_4_ = uVar1;
  auVar50._20_4_ = uVar1;
  auVar50._24_4_ = uVar1;
  auVar50._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x228);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x198);
  auVar23._4_4_ = uVar1;
  auVar23._0_4_ = uVar1;
  auVar23._8_4_ = uVar1;
  auVar23._12_4_ = uVar1;
  auVar23._16_4_ = uVar1;
  auVar23._20_4_ = uVar1;
  auVar23._24_4_ = uVar1;
  auVar23._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x248);
  auVar18._4_4_ = uVar1;
  auVar18._0_4_ = uVar1;
  auVar18._8_4_ = uVar1;
  auVar18._12_4_ = uVar1;
  auVar18._16_4_ = uVar1;
  auVar18._20_4_ = uVar1;
  auVar18._24_4_ = uVar1;
  auVar18._28_4_ = uVar1;
  auVar49 = vpmulld_avx2((undefined1  [32])*in,auVar49);
  auVar47 = vpmulld_avx2((undefined1  [32])*in,auVar47);
  auVar42 = vpmulld_avx2((undefined1  [32])in[2],auVar42);
  auVar35 = vpmulld_avx2((undefined1  [32])in[2],auVar35);
  auVar21 = vpmulld_avx2((undefined1  [32])in[4],auVar21);
  auVar29 = vpmulld_avx2((undefined1  [32])in[4],auVar29);
  auVar26 = vpmulld_avx2((undefined1  [32])in[6],auVar26);
  auVar24 = vpmulld_avx2((undefined1  [32])in[6],auVar24);
  auVar46 = vpmulld_avx2((undefined1  [32])in[7],auVar46);
  auVar45 = vpmulld_avx2((undefined1  [32])in[7],auVar45);
  auVar39 = vpmulld_avx2((undefined1  [32])in[5],auVar39);
  auVar50 = vpmulld_avx2((undefined1  [32])in[5],auVar50);
  auVar34 = vpmulld_avx2((undefined1  [32])in[3],auVar34);
  auVar23 = vpmulld_avx2((undefined1  [32])in[3],auVar23);
  auVar18 = vpmulld_avx2((undefined1  [32])in[1],auVar18);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x178);
  auVar19._4_4_ = uVar1;
  auVar19._0_4_ = uVar1;
  auVar19._8_4_ = uVar1;
  auVar19._12_4_ = uVar1;
  auVar19._16_4_ = uVar1;
  auVar19._20_4_ = uVar1;
  auVar19._24_4_ = uVar1;
  auVar19._28_4_ = uVar1;
  auVar19 = vpmulld_avx2((undefined1  [32])in[1],auVar19);
  auVar51._4_4_ = iVar13;
  auVar51._0_4_ = iVar13;
  auVar51._8_4_ = iVar13;
  auVar51._12_4_ = iVar13;
  auVar51._16_4_ = iVar13;
  auVar51._20_4_ = iVar13;
  auVar51._24_4_ = iVar13;
  auVar51._28_4_ = iVar13;
  auVar49 = vpaddd_avx2(auVar49,auVar51);
  auVar28 = vpsrad_avx2(auVar49,ZEXT416((uint)bit));
  auVar49 = vpaddd_avx2(auVar51,auVar46);
  auVar46 = vpsrad_avx2(auVar49,ZEXT416((uint)bit));
  auVar49 = vpaddd_avx2(auVar28,auVar46);
  auVar28 = vpsubd_avx2(auVar28,auVar46);
  auVar47 = vpsubd_avx2(auVar51,auVar47);
  auVar22 = ZEXT416((uint)bit);
  auVar46 = vpsrad_avx2(auVar47,auVar22);
  auVar47 = vpaddd_avx2(auVar45,auVar51);
  auVar45 = vpsrad_avx2(auVar47,auVar22);
  auVar47 = vpaddd_avx2(auVar45,auVar46);
  auVar30 = vpsubd_avx2(auVar46,auVar45);
  auVar42 = vpaddd_avx2(auVar42,auVar51);
  auVar46 = vpsrad_avx2(auVar42,auVar22);
  auVar42 = vpaddd_avx2(auVar39,auVar51);
  auVar45 = vpsrad_avx2(auVar42,auVar22);
  auVar42 = vpaddd_avx2(auVar45,auVar46);
  auVar39 = vpsubd_avx2(auVar46,auVar45);
  auVar35 = vpsubd_avx2(auVar51,auVar35);
  auVar22 = ZEXT416((uint)bit);
  auVar46 = vpsrad_avx2(auVar35,auVar22);
  auVar35 = vpaddd_avx2(auVar51,auVar50);
  auVar45 = vpsrad_avx2(auVar35,auVar22);
  auVar35 = vpaddd_avx2(auVar45,auVar46);
  auVar50 = vpsubd_avx2(auVar46,auVar45);
  auVar21 = vpaddd_avx2(auVar51,auVar21);
  auVar46 = vpsrad_avx2(auVar21,auVar22);
  auVar21 = vpaddd_avx2(auVar34,auVar51);
  auVar45 = vpsrad_avx2(auVar21,auVar22);
  auVar21 = vpaddd_avx2(auVar45,auVar46);
  auVar34 = vpsubd_avx2(auVar46,auVar45);
  auVar29 = vpsubd_avx2(auVar51,auVar29);
  auVar46 = vpsrad_avx2(auVar29,auVar22);
  auVar29 = vpaddd_avx2(auVar51,auVar23);
  auVar45 = vpsrad_avx2(auVar29,auVar22);
  auVar29 = vpaddd_avx2(auVar45,auVar46);
  auVar23 = vpsubd_avx2(auVar46,auVar45);
  auVar26 = vpaddd_avx2(auVar51,auVar26);
  auVar46 = vpsrad_avx2(auVar26,auVar22);
  auVar26 = vpaddd_avx2(auVar51,auVar18);
  auVar45 = vpsrad_avx2(auVar26,auVar22);
  auVar26 = vpaddd_avx2(auVar45,auVar46);
  auVar18 = vpsubd_avx2(auVar46,auVar45);
  auVar24 = vpsubd_avx2(auVar51,auVar24);
  auVar22 = ZEXT416((uint)bit);
  auVar46 = vpsrad_avx2(auVar24,auVar22);
  auVar24 = vpaddd_avx2(auVar19,auVar51);
  auVar45 = vpsrad_avx2(auVar24,auVar22);
  auVar24 = vpaddd_avx2(auVar45,auVar46);
  auVar46 = vpsubd_avx2(auVar46,auVar45);
  iVar13 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x240);
  iVar15 = -iVar13;
  iVar11 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x1c0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar12 + 0x220);
  iVar14 = -iVar11;
  iVar16 = -iVar2;
  iVar17 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar10 = 0x8000;
  if (0xf < iVar17) {
    iVar10 = 1 << ((char)iVar17 - 1U & 0x1f);
  }
  iVar17 = -iVar10;
  iVar10 = iVar10 + -1;
  auVar43._4_4_ = iVar13;
  auVar43._0_4_ = iVar13;
  auVar43._8_4_ = iVar13;
  auVar43._12_4_ = iVar13;
  auVar43._16_4_ = iVar13;
  auVar43._20_4_ = iVar13;
  auVar43._24_4_ = iVar13;
  auVar43._28_4_ = iVar13;
  auVar27._4_4_ = iVar17;
  auVar27._0_4_ = iVar17;
  auVar27._8_4_ = iVar17;
  auVar27._12_4_ = iVar17;
  auVar27._16_4_ = iVar17;
  auVar27._20_4_ = iVar17;
  auVar27._24_4_ = iVar17;
  auVar27._28_4_ = iVar17;
  auVar25._4_4_ = iVar10;
  auVar25._0_4_ = iVar10;
  auVar25._8_4_ = iVar10;
  auVar25._12_4_ = iVar10;
  auVar25._16_4_ = iVar10;
  auVar25._20_4_ = iVar10;
  auVar25._24_4_ = iVar10;
  auVar25._28_4_ = iVar10;
  auVar45 = vpmaxsd_avx2(auVar28,auVar27);
  auVar19 = vpminsd_avx2(auVar45,auVar25);
  auVar45 = vpmaxsd_avx2(auVar30,auVar27);
  auVar28 = vpminsd_avx2(auVar45,auVar25);
  auVar30 = vpmulld_avx2(auVar19,auVar43);
  auVar43 = vpmulld_avx2(auVar28,auVar43);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x180);
  auVar38._4_4_ = uVar1;
  auVar38._0_4_ = uVar1;
  auVar38._8_4_ = uVar1;
  auVar38._12_4_ = uVar1;
  auVar38._16_4_ = uVar1;
  auVar38._20_4_ = uVar1;
  auVar38._24_4_ = uVar1;
  auVar38._28_4_ = uVar1;
  auVar45 = vpmulld_avx2(auVar19,auVar38);
  auVar45 = vpaddd_avx2(auVar45,auVar51);
  auVar45 = vpaddd_avx2(auVar45,auVar43);
  auVar28 = vpmulld_avx2(auVar38,auVar28);
  auVar19 = vpaddd_avx2(auVar51,auVar30);
  auVar43 = vpsubd_avx2(auVar19,auVar28);
  auVar30._4_4_ = iVar11;
  auVar30._0_4_ = iVar11;
  auVar30._8_4_ = iVar11;
  auVar30._12_4_ = iVar11;
  auVar30._16_4_ = iVar11;
  auVar30._20_4_ = iVar11;
  auVar30._24_4_ = iVar11;
  auVar30._28_4_ = iVar11;
  auVar39 = vpmaxsd_avx2(auVar39,auVar27);
  auVar19 = vpminsd_avx2(auVar39,auVar25);
  auVar39 = vpmaxsd_avx2(auVar50,auVar27);
  auVar50 = vpminsd_avx2(auVar39,auVar25);
  auVar28 = vpmulld_avx2(auVar50,auVar30);
  auVar30 = vpmulld_avx2(auVar19,auVar30);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x200);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  auVar39 = vpmulld_avx2(auVar19,auVar31);
  auVar39 = vpaddd_avx2(auVar39,auVar51);
  auVar39 = vpaddd_avx2(auVar39,auVar28);
  auVar19 = vpmulld_avx2(auVar31,auVar50);
  auVar50 = vpaddd_avx2(auVar30,auVar51);
  auVar30 = vpsubd_avx2(auVar50,auVar19);
  auVar36._4_4_ = iVar15;
  auVar36._0_4_ = iVar15;
  auVar36._8_4_ = iVar15;
  auVar36._12_4_ = iVar15;
  auVar36._16_4_ = iVar15;
  auVar36._20_4_ = iVar15;
  auVar36._24_4_ = iVar15;
  auVar36._28_4_ = iVar15;
  auVar50 = vpmaxsd_avx2(auVar34,auVar27);
  auVar34 = vpminsd_avx2(auVar50,auVar25);
  auVar50 = vpmaxsd_avx2(auVar23,auVar27);
  auVar23 = vpminsd_avx2(auVar50,auVar25);
  auVar19 = vpmulld_avx2(auVar23,auVar38);
  auVar28 = vpmulld_avx2(auVar34,auVar38);
  auVar50 = vpmulld_avx2(auVar34,auVar36);
  auVar50 = vpaddd_avx2(auVar50,auVar51);
  auVar50 = vpaddd_avx2(auVar50,auVar19);
  auVar23 = vpmulld_avx2(auVar36,auVar23);
  auVar34 = vpaddd_avx2(auVar28,auVar51);
  auVar28 = vpsubd_avx2(auVar34,auVar23);
  auVar40._4_4_ = iVar14;
  auVar40._0_4_ = iVar14;
  auVar40._8_4_ = iVar14;
  auVar40._12_4_ = iVar14;
  auVar40._16_4_ = iVar14;
  auVar40._20_4_ = iVar14;
  auVar40._24_4_ = iVar14;
  auVar40._28_4_ = iVar14;
  auVar34 = vpmaxsd_avx2(auVar18,auVar27);
  auVar34 = vpminsd_avx2(auVar34,auVar25);
  auVar46 = vpmaxsd_avx2(auVar46,auVar27);
  auVar23 = vpminsd_avx2(auVar46,auVar25);
  auVar18 = vpmulld_avx2(auVar23,auVar31);
  auVar19 = vpmulld_avx2(auVar34,auVar31);
  auVar46 = vpmulld_avx2(auVar34,auVar40);
  auVar46 = vpaddd_avx2(auVar46,auVar51);
  auVar46 = vpaddd_avx2(auVar46,auVar18);
  auVar23 = vpmulld_avx2(auVar40,auVar23);
  auVar34 = vpaddd_avx2(auVar51,auVar19);
  auVar23 = vpsubd_avx2(auVar34,auVar23);
  auVar49 = vpmaxsd_avx2(auVar27,auVar49);
  auVar34 = vpminsd_avx2(auVar49,auVar25);
  auVar49 = vpmaxsd_avx2(auVar27,auVar21);
  auVar21 = vpminsd_avx2(auVar49,auVar25);
  auVar49 = vpaddd_avx2(auVar21,auVar34);
  auVar34 = vpsubd_avx2(auVar34,auVar21);
  auVar47 = vpmaxsd_avx2(auVar27,auVar47);
  auVar21 = vpminsd_avx2(auVar47,auVar25);
  auVar47 = vpmaxsd_avx2(auVar27,auVar29);
  auVar29 = vpminsd_avx2(auVar47,auVar25);
  auVar47 = vpaddd_avx2(auVar29,auVar21);
  auVar18 = vpsubd_avx2(auVar21,auVar29);
  auVar42 = vpmaxsd_avx2(auVar27,auVar42);
  auVar21 = vpminsd_avx2(auVar42,auVar25);
  auVar42 = vpmaxsd_avx2(auVar27,auVar26);
  auVar29 = vpminsd_avx2(auVar42,auVar25);
  auVar42 = vpaddd_avx2(auVar29,auVar21);
  auVar19 = vpsubd_avx2(auVar21,auVar29);
  auVar35 = vpmaxsd_avx2(auVar27,auVar35);
  auVar21 = vpminsd_avx2(auVar35,auVar25);
  auVar35 = vpmaxsd_avx2(auVar27,auVar24);
  auVar29 = vpminsd_avx2(auVar35,auVar25);
  auVar35 = vpaddd_avx2(auVar29,auVar21);
  auVar31 = vpsubd_avx2(auVar21,auVar29);
  auVar29 = vpsrad_avx2(auVar45,auVar22);
  auVar26 = vpsrad_avx2(auVar50,auVar22);
  auVar21 = vpaddd_avx2(auVar29,auVar26);
  auVar36 = vpsubd_avx2(auVar29,auVar26);
  auVar26 = vpsrad_avx2(auVar43,auVar22);
  auVar24 = vpsrad_avx2(auVar28,auVar22);
  auVar29 = vpaddd_avx2(auVar24,auVar26);
  auVar28 = vpsubd_avx2(auVar26,auVar24);
  auVar24 = vpsrad_avx2(auVar39,auVar22);
  auVar46 = vpsrad_avx2(auVar46,auVar22);
  auVar26 = vpaddd_avx2(auVar46,auVar24);
  auVar43 = vpsubd_avx2(auVar24,auVar46);
  auVar46 = vpsrad_avx2(auVar30,auVar22);
  auVar45 = vpsrad_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar45,auVar46);
  auVar30 = vpsubd_avx2(auVar46,auVar45);
  auVar20._4_4_ = iVar2;
  auVar20._0_4_ = iVar2;
  auVar20._8_4_ = iVar2;
  auVar20._12_4_ = iVar2;
  auVar20._16_4_ = iVar2;
  auVar20._20_4_ = iVar2;
  auVar20._24_4_ = iVar2;
  auVar20._28_4_ = iVar2;
  auVar46 = vpmaxsd_avx2(auVar34,auVar27);
  auVar45 = vpminsd_avx2(auVar46,auVar25);
  auVar46 = vpmaxsd_avx2(auVar18,auVar27);
  auVar39 = vpminsd_avx2(auVar46,auVar25);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1a0);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar46 = vpmulld_avx2(auVar45,auVar41);
  auVar46 = vpaddd_avx2(auVar46,auVar51);
  auVar50 = vpmulld_avx2(auVar39,auVar20);
  auVar46 = vpaddd_avx2(auVar46,auVar50);
  auVar45 = vpmulld_avx2(auVar45,auVar20);
  auVar39 = vpmulld_avx2(auVar41,auVar39);
  auVar45 = vpaddd_avx2(auVar51,auVar45);
  auVar38 = vpsubd_avx2(auVar45,auVar39);
  auVar32._4_4_ = iVar16;
  auVar32._0_4_ = iVar16;
  auVar32._8_4_ = iVar16;
  auVar32._12_4_ = iVar16;
  auVar32._16_4_ = iVar16;
  auVar32._20_4_ = iVar16;
  auVar32._24_4_ = iVar16;
  auVar32._28_4_ = iVar16;
  auVar45 = vpmaxsd_avx2(auVar19,auVar27);
  auVar39 = vpminsd_avx2(auVar45,auVar25);
  auVar45 = vpmaxsd_avx2(auVar31,auVar27);
  auVar50 = vpminsd_avx2(auVar45,auVar25);
  auVar45 = vpmulld_avx2(auVar39,auVar32);
  auVar45 = vpaddd_avx2(auVar51,auVar45);
  auVar34 = vpmulld_avx2(auVar50,auVar41);
  auVar45 = vpaddd_avx2(auVar34,auVar45);
  auVar39 = vpmulld_avx2(auVar39,auVar41);
  auVar50 = vpmulld_avx2(auVar32,auVar50);
  auVar39 = vpaddd_avx2(auVar39,auVar51);
  auVar31 = vpsubd_avx2(auVar39,auVar50);
  auVar39 = vpmaxsd_avx2(auVar36,auVar27);
  auVar50 = vpminsd_avx2(auVar39,auVar25);
  auVar39 = vpmaxsd_avx2(auVar28,auVar27);
  auVar34 = vpminsd_avx2(auVar39,auVar25);
  auVar23 = vpmulld_avx2(auVar34,auVar20);
  auVar18 = vpmulld_avx2(auVar50,auVar20);
  auVar39 = vpmulld_avx2(auVar50,auVar41);
  auVar39 = vpaddd_avx2(auVar39,auVar51);
  auVar39 = vpaddd_avx2(auVar39,auVar23);
  auVar34 = vpmulld_avx2(auVar41,auVar34);
  auVar50 = vpaddd_avx2(auVar18,auVar51);
  auVar28 = vpsubd_avx2(auVar50,auVar34);
  auVar50 = vpmaxsd_avx2(auVar43,auVar27);
  auVar34 = vpminsd_avx2(auVar50,auVar25);
  auVar50 = vpmaxsd_avx2(auVar30,auVar27);
  auVar23 = vpminsd_avx2(auVar50,auVar25);
  auVar18 = vpmulld_avx2(auVar23,auVar41);
  auVar19 = vpmulld_avx2(auVar34,auVar41);
  auVar50 = vpmulld_avx2(auVar34,auVar32);
  auVar50 = vpaddd_avx2(auVar51,auVar50);
  auVar50 = vpaddd_avx2(auVar18,auVar50);
  auVar23 = vpmulld_avx2(auVar32,auVar23);
  auVar34 = vpaddd_avx2(auVar19,auVar51);
  auVar23 = vpsubd_avx2(auVar34,auVar23);
  auVar49 = vpmaxsd_avx2(auVar27,auVar49);
  auVar34 = vpminsd_avx2(auVar49,auVar25);
  auVar49 = vpmaxsd_avx2(auVar27,auVar42);
  auVar42 = vpminsd_avx2(auVar49,auVar25);
  auVar49 = vpaddd_avx2(auVar42,auVar34);
  auVar34 = vpsubd_avx2(auVar34,auVar42);
  auVar47 = vpmaxsd_avx2(auVar27,auVar47);
  auVar42 = vpminsd_avx2(auVar47,auVar25);
  auVar47 = vpmaxsd_avx2(auVar27,auVar35);
  auVar35 = vpminsd_avx2(auVar47,auVar25);
  auVar47 = vpaddd_avx2(auVar35,auVar42);
  auVar18 = vpsubd_avx2(auVar42,auVar35);
  auVar35 = vpsrad_avx2(auVar46,auVar22);
  auVar46 = vpsrad_avx2(auVar45,auVar22);
  auVar42 = vpaddd_avx2(auVar46,auVar35);
  auVar19 = vpsubd_avx2(auVar35,auVar46);
  auVar46 = vpsrad_avx2(auVar38,auVar22);
  auVar45 = vpsrad_avx2(auVar31,auVar22);
  auVar35 = vpaddd_avx2(auVar45,auVar46);
  auVar30 = vpsubd_avx2(auVar46,auVar45);
  auVar21 = vpmaxsd_avx2(auVar27,auVar21);
  auVar46 = vpminsd_avx2(auVar21,auVar25);
  auVar21 = vpmaxsd_avx2(auVar27,auVar26);
  auVar26 = vpminsd_avx2(auVar21,auVar25);
  auVar21 = vpaddd_avx2(auVar26,auVar46);
  auVar43 = vpsubd_avx2(auVar46,auVar26);
  auVar29 = vpmaxsd_avx2(auVar27,auVar29);
  auVar26 = vpminsd_avx2(auVar29,auVar25);
  auVar29 = vpmaxsd_avx2(auVar27,auVar24);
  auVar24 = vpminsd_avx2(auVar29,auVar25);
  auVar29 = vpaddd_avx2(auVar24,auVar26);
  auVar31 = vpsubd_avx2(auVar26,auVar24);
  auVar24 = vpsrad_avx2(auVar39,auVar22);
  auVar46 = vpsrad_avx2(auVar50,auVar22);
  auVar26 = vpaddd_avx2(auVar46,auVar24);
  auVar36 = vpsubd_avx2(auVar24,auVar46);
  auVar22 = ZEXT416((uint)bit);
  auVar46 = vpsrad_avx2(auVar28,auVar22);
  auVar45 = vpsrad_avx2(auVar23,auVar22);
  auVar24 = vpaddd_avx2(auVar46,auVar45);
  auVar28 = vpsubd_avx2(auVar46,auVar45);
  auVar49 = vpmaxsd_avx2(auVar49,auVar27);
  auVar46 = vpmaxsd_avx2(auVar34,auVar27);
  auVar47 = vpmaxsd_avx2(auVar47,auVar27);
  auVar45 = vpmaxsd_avx2(auVar18,auVar27);
  auVar42 = vpmaxsd_avx2(auVar42,auVar27);
  auVar39 = vpmaxsd_avx2(auVar27,auVar19);
  auVar35 = vpmaxsd_avx2(auVar27,auVar35);
  auVar50 = vpmaxsd_avx2(auVar27,auVar30);
  auVar21 = vpmaxsd_avx2(auVar27,auVar21);
  auVar34 = vpmaxsd_avx2(auVar27,auVar43);
  auVar29 = vpmaxsd_avx2(auVar27,auVar29);
  auVar23 = vpmaxsd_avx2(auVar27,auVar31);
  auVar26 = vpmaxsd_avx2(auVar27,auVar26);
  auVar18 = vpmaxsd_avx2(auVar27,auVar36);
  auVar24 = vpmaxsd_avx2(auVar24,auVar27);
  auVar19 = vpmaxsd_avx2(auVar27,auVar28);
  alVar3 = (__m256i)vpminsd_avx2(auVar49,auVar25);
  auVar49 = vpminsd_avx2(auVar46,auVar25);
  auVar46 = vpminsd_avx2(auVar47,auVar25);
  auVar47 = vpminsd_avx2(auVar45,auVar25);
  auVar45 = vpminsd_avx2(auVar42,auVar25);
  auVar42 = vpminsd_avx2(auVar39,auVar25);
  alVar4 = (__m256i)vpminsd_avx2(auVar35,auVar25);
  auVar35 = vpminsd_avx2(auVar50,auVar25);
  auVar39 = vpminsd_avx2(auVar21,auVar25);
  auVar21 = vpminsd_avx2(auVar34,auVar25);
  alVar5 = (__m256i)vpminsd_avx2(auVar25,auVar29);
  auVar29 = vpminsd_avx2(auVar25,auVar23);
  alVar6 = (__m256i)vpminsd_avx2(auVar25,auVar26);
  auVar26 = vpminsd_avx2(auVar25,auVar18);
  auVar24 = vpminsd_avx2(auVar24,auVar25);
  auVar50 = vpminsd_avx2(auVar19,auVar25);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar12 + 0x1e0);
  auVar28._4_4_ = uVar1;
  auVar28._0_4_ = uVar1;
  auVar28._8_4_ = uVar1;
  auVar28._12_4_ = uVar1;
  auVar28._16_4_ = uVar1;
  auVar28._20_4_ = uVar1;
  auVar28._24_4_ = uVar1;
  auVar28._28_4_ = uVar1;
  auVar49 = vpmulld_avx2(auVar49,auVar28);
  auVar34 = vpmulld_avx2(auVar47,auVar28);
  auVar49 = vpaddd_avx2(auVar51,auVar49);
  auVar47 = vpaddd_avx2(auVar49,auVar34);
  auVar34 = vpsubd_avx2(auVar49,auVar34);
  auVar49 = vpmulld_avx2(auVar42,auVar28);
  auVar35 = vpmulld_avx2(auVar35,auVar28);
  auVar49 = vpaddd_avx2(auVar51,auVar49);
  auVar42 = vpaddd_avx2(auVar49,auVar35);
  auVar23 = vpsubd_avx2(auVar49,auVar35);
  auVar49 = vpmulld_avx2(auVar21,auVar28);
  auVar21 = vpmulld_avx2(auVar29,auVar28);
  auVar49 = vpaddd_avx2(auVar51,auVar49);
  auVar35 = vpaddd_avx2(auVar21,auVar49);
  auVar18 = vpsubd_avx2(auVar49,auVar21);
  auVar49 = vpmulld_avx2(auVar26,auVar28);
  auVar29 = vpmulld_avx2(auVar50,auVar28);
  auVar49 = vpaddd_avx2(auVar49,auVar51);
  auVar21 = vpaddd_avx2(auVar49,auVar29);
  auVar29 = vpsubd_avx2(auVar49,auVar29);
  auVar49 = vpsrad_avx2(auVar47,auVar22);
  alVar7 = (__m256i)vpsrad_avx2(auVar34,auVar22);
  alVar8 = (__m256i)vpsrad_avx2(auVar42,auVar22);
  auVar47 = vpsrad_avx2(auVar23,auVar22);
  alVar9 = (__m256i)vpsrad_avx2(auVar35,auVar22);
  auVar42 = vpsrad_avx2(auVar18,auVar22);
  auVar35 = vpsrad_avx2(auVar21,auVar22);
  alVar33 = (__m256i)vpsrad_avx2(auVar29,auVar22);
  if (do_cols == 0) {
    iVar13 = 10;
    if (10 < bd) {
      iVar13 = bd;
    }
    iVar13 = 0x20 << ((byte)iVar13 & 0x1f);
    iVar11 = -iVar13;
    auVar37._4_4_ = iVar11;
    auVar37._0_4_ = iVar11;
    auVar37._8_4_ = iVar11;
    auVar37._12_4_ = iVar11;
    auVar37._16_4_ = iVar11;
    auVar37._20_4_ = iVar11;
    auVar37._24_4_ = iVar11;
    auVar37._28_4_ = iVar11;
    iVar13 = iVar13 + -1;
    iVar11 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar48._4_4_ = iVar11;
    auVar48._0_4_ = iVar11;
    auVar48._8_4_ = iVar11;
    auVar48._12_4_ = iVar11;
    auVar48._16_4_ = iVar11;
    auVar48._20_4_ = iVar11;
    auVar48._24_4_ = iVar11;
    auVar48._28_4_ = iVar11;
    auVar21 = vpaddd_avx2(auVar48,(undefined1  [32])alVar3);
    auVar21 = vpsrad_avx2(auVar21,ZEXT416((uint)out_shift));
    auVar44._4_4_ = iVar13;
    auVar44._0_4_ = iVar13;
    auVar44._8_4_ = iVar13;
    auVar44._12_4_ = iVar13;
    auVar44._16_4_ = iVar13;
    auVar44._20_4_ = iVar13;
    auVar44._24_4_ = iVar13;
    auVar44._28_4_ = iVar13;
    auVar21 = vpmaxsd_avx2(auVar21,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar21,auVar44);
    *out = alVar3;
    auVar21 = vpsubd_avx2(auVar48,auVar39);
    auVar21 = vpsrad_avx2(auVar21,ZEXT416((uint)out_shift));
    auVar21 = vpmaxsd_avx2(auVar21,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar21,auVar44);
    auVar21 = vpaddd_avx2((undefined1  [32])alVar6,auVar48);
    auVar22 = ZEXT416((uint)out_shift);
    auVar21 = vpsrad_avx2(auVar21,auVar22);
    out[1] = alVar3;
    auVar21 = vpmaxsd_avx2(auVar21,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar21,auVar44);
    out[2] = alVar3;
    auVar21 = vpsubd_avx2(auVar48,auVar45);
    auVar21 = vpsrad_avx2(auVar21,auVar22);
    auVar21 = vpmaxsd_avx2(auVar21,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar21,auVar44);
    auVar21 = vpaddd_avx2(auVar48,(undefined1  [32])alVar8);
    auVar21 = vpsrad_avx2(auVar21,auVar22);
    out[3] = alVar3;
    auVar21 = vpmaxsd_avx2(auVar21,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar21,auVar44);
    out[4] = alVar3;
    auVar35 = vpsubd_avx2(auVar48,auVar35);
    auVar35 = vpsrad_avx2(auVar35,auVar22);
    auVar35 = vpmaxsd_avx2(auVar35,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar35,auVar44);
    auVar35 = vpaddd_avx2((undefined1  [32])alVar9,auVar48);
    auVar22 = ZEXT416((uint)out_shift);
    auVar35 = vpsrad_avx2(auVar35,auVar22);
    out[5] = alVar3;
    auVar35 = vpmaxsd_avx2(auVar35,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar35,auVar44);
    out[6] = alVar3;
    auVar49 = vpsubd_avx2(auVar48,auVar49);
    auVar49 = vpsrad_avx2(auVar49,auVar22);
    auVar49 = vpmaxsd_avx2(auVar49,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar49,auVar44);
    auVar49 = vpaddd_avx2((undefined1  [32])alVar7,auVar48);
    auVar49 = vpsrad_avx2(auVar49,auVar22);
    out[7] = alVar3;
    auVar49 = vpmaxsd_avx2(auVar49,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar49,auVar44);
    out[8] = alVar3;
    auVar49 = vpsubd_avx2(auVar48,auVar42);
    auVar49 = vpsrad_avx2(auVar49,auVar22);
    auVar49 = vpmaxsd_avx2(auVar49,auVar37);
    alVar3 = (__m256i)vpminsd_avx2(auVar49,auVar44);
    out[9] = alVar3;
    auVar49 = vpaddd_avx2(auVar48,(undefined1  [32])alVar33);
    auVar35 = vpsubd_avx2(auVar48,auVar47);
    auVar47 = vpaddd_avx2(auVar48,(undefined1  [32])alVar4);
    auVar29 = vpsubd_avx2(auVar48,auVar24);
    auVar42 = vpaddd_avx2(auVar48,(undefined1  [32])alVar5);
    auVar24 = vpsubd_avx2(auVar48,auVar46);
    auVar49 = vpsrad_avx2(auVar49,auVar22);
    auVar35 = vpsrad_avx2(auVar35,auVar22);
    auVar21 = vpsrad_avx2(auVar47,auVar22);
    auVar29 = vpsrad_avx2(auVar29,auVar22);
    auVar26 = vpsrad_avx2(auVar42,ZEXT416((uint)out_shift));
    auVar24 = vpsrad_avx2(auVar24,ZEXT416((uint)out_shift));
    auVar49 = vpmaxsd_avx2(auVar49,auVar37);
    auVar47 = vpmaxsd_avx2(auVar35,auVar37);
    auVar42 = vpmaxsd_avx2(auVar21,auVar37);
    auVar35 = vpmaxsd_avx2(auVar29,auVar37);
    auVar21 = vpmaxsd_avx2(auVar26,auVar37);
    auVar29 = vpmaxsd_avx2(auVar24,auVar37);
    alVar33 = (__m256i)vpminsd_avx2(auVar49,auVar44);
    alVar3 = (__m256i)vpminsd_avx2(auVar47,auVar44);
    alVar4 = (__m256i)vpminsd_avx2(auVar42,auVar44);
    alVar6 = (__m256i)vpminsd_avx2(auVar35,auVar44);
    alVar5 = (__m256i)vpminsd_avx2(auVar21,auVar44);
    alVar7 = (__m256i)vpminsd_avx2(auVar29,auVar44);
  }
  else {
    *out = alVar3;
    auVar21 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar3 = (__m256i)vpsubd_avx2(auVar21,auVar39);
    out[1] = alVar3;
    out[2] = alVar6;
    alVar3 = (__m256i)vpsubd_avx2(auVar21,auVar45);
    out[3] = alVar3;
    out[4] = alVar8;
    alVar3 = (__m256i)vpsubd_avx2(auVar21,auVar35);
    out[5] = alVar3;
    out[6] = alVar9;
    alVar3 = (__m256i)vpsubd_avx2(auVar21,auVar49);
    out[7] = alVar3;
    out[8] = alVar7;
    alVar3 = (__m256i)vpsubd_avx2(auVar21,auVar42);
    out[9] = alVar3;
    alVar3 = (__m256i)vpsubd_avx2(auVar21,auVar47);
    alVar6 = (__m256i)vpsubd_avx2(auVar21,auVar24);
    alVar7 = (__m256i)vpsubd_avx2(auVar21,auVar46);
  }
  out[10] = alVar33;
  out[0xb] = alVar3;
  out[0xc] = alVar4;
  out[0xd] = alVar6;
  out[0xe] = alVar5;
  out[0xf] = alVar7;
  return;
}

Assistant:

static void iadst16_low8_avx2(const __m256i *input, __m256i *output) {
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m256i _r = _mm256_set1_epi32(1 << (INV_COS_BIT - 1));

  // stage 1
  __m256i x1[16];
  x1[1] = input[0];
  x1[3] = input[2];
  x1[5] = input[4];
  x1[7] = input[6];
  x1[8] = input[7];
  x1[10] = input[5];
  x1[12] = input[3];
  x1[14] = input[1];

  // stage 2
  btf_16_w16_0_avx2(cospi[62], -cospi[2], x1[1], x1[0], x1[1]);
  btf_16_w16_0_avx2(cospi[54], -cospi[10], x1[3], x1[2], x1[3]);
  btf_16_w16_0_avx2(cospi[46], -cospi[18], x1[5], x1[4], x1[5]);
  btf_16_w16_0_avx2(cospi[38], -cospi[26], x1[7], x1[6], x1[7]);
  btf_16_w16_0_avx2(cospi[34], cospi[30], x1[8], x1[8], x1[9]);
  btf_16_w16_0_avx2(cospi[42], cospi[22], x1[10], x1[10], x1[11]);
  btf_16_w16_0_avx2(cospi[50], cospi[14], x1[12], x1[12], x1[13]);
  btf_16_w16_0_avx2(cospi[58], cospi[06], x1[14], x1[14], x1[15]);

  iadst16_stage3_avx2(x1);
  iadst16_stage4_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage5_avx2(x1);
  iadst16_stage6_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage7_avx2(x1);
  iadst16_stage8_avx2(x1, cospi, _r, INV_COS_BIT);
  iadst16_stage9_avx2(output, x1);
}